

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UDPServer.cpp
# Opt level: O2

void __thiscall UDPServer::on_upload(UDPServer *this,Poll *poll,Complex *complex)

{
  shared_ptr<SharedDirectory> *psVar1;
  size_type *psVar2;
  SharedDirectory *this_00;
  uint64_t uVar3;
  _Alloc_hider _Var4;
  undefined8 uVar5;
  bool bVar6;
  int iVar7;
  pointer p_Var8;
  ostream *poVar9;
  __allocator_type __a2;
  string nil;
  shared_ptr<TCPServer> tcp;
  Complex ok;
  undefined8 uStack_1c8;
  _Any_data local_1b8 [2];
  weak_ptr<TCPServer> server;
  shared_ptr<SharedDirectory> sdir;
  string file_name;
  __shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2> local_158;
  shared_ptr<Alarm> alarm;
  __shared_ptr<Subscriber,(__gnu_cxx::_Lock_policy)2> local_138 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_130;
  string local_128;
  string local_108;
  path local_e8;
  string local_c8;
  undefined1 local_a8 [56];
  undefined1 local_70 [64];
  
  std::__cxx11::string::string((string *)&file_name,(string *)&complex->payload);
  bVar6 = SharedDirectory::can_create_file
                    ((this->dir).super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,(complex->header).param,&file_name);
  if (bVar6) {
    psVar1 = &this->dir;
    SharedDirectory::reserve_file
              ((psVar1->super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr,
               &file_name,(complex->header).param);
    std::__shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&sdir.super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>,
               &psVar1->super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&nil,"FileUploadServer-",(allocator<char> *)&server);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ok,&nil,
                   &file_name);
    this_00 = (psVar1->super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    std::__cxx11::string::string((string *)&local_108,(string *)&file_name);
    SharedDirectory::path_in_dir(&local_e8,this_00,&local_108);
    FileReceiveSession::create_session_factory((SessionFactory *)local_1b8,&local_e8);
    std::
    make_shared<TCPServer,std::__cxx11::string,std::function<std::shared_ptr<Subscriber>(Poll&,TCPServer&,sockaddr_in)>>
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&tcp,
               (function<std::shared_ptr<Subscriber>_(Poll_&,_TCPServer_&,_sockaddr_in)> *)&ok);
    std::_Function_base::~_Function_base((_Function_base *)local_1b8);
    std::__cxx11::string::~string((string *)&local_e8);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&ok);
    std::__cxx11::string::~string((string *)&nil);
    std::__shared_ptr<Subscriber,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<TCPServer,void>
              (local_138,&tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>);
    Poll::subscribe(poll,(shared_ptr<Subscriber> *)local_138);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_130);
    std::__weak_ptr<TCPServer,(__gnu_cxx::_Lock_policy)2>::__weak_ptr<TCPServer,void>
              ((__weak_ptr<TCPServer,(__gnu_cxx::_Lock_policy)2> *)
               &server.super___weak_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>,
               &tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>);
    iVar7 = this->timeout;
    std::__weak_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>::__weak_ptr
              ((__weak_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2> *)&ok,
               &server.super___weak_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>);
    ok.header._16_8_ = poll;
    std::__cxx11::string::string((string *)((long)&ok.header.param + 6),(string *)&file_name);
    std::__shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              ((__shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2> *)
               ((long)&ok.payload.field_2 + 8),
               &sdir.super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>);
    alarm.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
    p_Var8 = std::
             allocator_traits<std::allocator<std::_Sp_counted_ptr_inplace<Alarm,_std::allocator<Alarm>,_(__gnu_cxx::_Lock_policy)2>_>_>
             ::allocate(&__a2,1);
    (p_Var8->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_use_count = 1;
    (p_Var8->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._M_weak_count = 1;
    (p_Var8->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>)._vptr__Sp_counted_base =
         (_func_int **)&PTR___Sp_counted_ptr_inplace_001407a8;
    nil.field_2._M_allocated_capacity = 0;
    nil.field_2._8_8_ = 0;
    nil._M_dataplus._M_p = (pointer)0x0;
    nil._M_string_length = 0;
    local_1b8[0]._0_8_ = &__a2;
    local_1b8[0]._8_8_ = p_Var8;
    nil._M_dataplus._M_p = (pointer)operator_new(0x48);
    uVar5 = ok.payload.field_2._8_8_;
    _Var4 = ok.payload._M_dataplus;
    psVar2 = &ok.payload._M_string_length;
    *(undefined8 *)nil._M_dataplus._M_p = ok.header.cmd._0_8_;
    *(undefined8 *)(nil._M_dataplus._M_p + 8) = ok.header._8_8_;
    ok.header.cmd[0] = '\0';
    ok.header.cmd[1] = '\0';
    ok.header.cmd[2] = '\0';
    ok.header.cmd[3] = '\0';
    ok.header.cmd[4] = '\0';
    ok.header.cmd[5] = '\0';
    ok.header.cmd[6] = '\0';
    ok.header.cmd[7] = '\0';
    ok.header._8_8_ = 0;
    *(undefined8 *)(nil._M_dataplus._M_p + 0x10) = ok.header._16_8_;
    *(pointer *)(nil._M_dataplus._M_p + 0x18) = nil._M_dataplus._M_p + 0x28;
    if ((size_type *)ok._24_8_ == psVar2) {
      *(ulong *)(nil._M_dataplus._M_p + 0x28) =
           CONCAT71(ok.payload._M_string_length._1_7_,(undefined1)ok.payload._M_string_length);
      *(size_type *)(nil._M_dataplus._M_p + 0x30) = ok.payload.field_2._M_allocated_capacity;
    }
    else {
      *(undefined8 *)(nil._M_dataplus._M_p + 0x18) = ok._24_8_;
      *(ulong *)(nil._M_dataplus._M_p + 0x28) =
           CONCAT71(ok.payload._M_string_length._1_7_,(undefined1)ok.payload._M_string_length);
    }
    ok.payload._M_dataplus._M_p = (pointer)0x0;
    ok.payload._M_string_length._0_1_ = 0;
    ok.payload.field_2._8_8_ = 0;
    *(pointer *)(nil._M_dataplus._M_p + 0x20) = _Var4._M_p;
    *(undefined8 *)(nil._M_dataplus._M_p + 0x38) = uVar5;
    *(undefined8 *)(nil._M_dataplus._M_p + 0x40) = uStack_1c8;
    nil.field_2._8_8_ =
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/UDPServer.cpp:190:56)>
         ::_M_invoke;
    nil.field_2._M_allocated_capacity =
         (size_type)
         std::
         _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/samvel1024[P]dist-fs/src/UDPServer.cpp:190:56)>
         ::_M_manager;
    ok._24_8_ = psVar2;
    Alarm::Alarm((Alarm *)&p_Var8->_M_impl,(long)iVar7 * 1000,(function<void_()> *)&nil);
    std::_Function_base::~_Function_base((_Function_base *)&nil);
    local_1b8[0]._8_8_ = 0;
    alarm.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
         (element_type *)&p_Var8->_M_impl;
    alarm.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         &p_Var8->super__Sp_counted_base<(__gnu_cxx::_Lock_policy)2>;
    std::
    __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Alarm,_std::allocator<Alarm>,_(__gnu_cxx::_Lock_policy)2>_>_>
    ::~__allocated_ptr((__allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<Alarm,_std::allocator<Alarm>,_(__gnu_cxx::_Lock_policy)2>_>_>
                        *)local_1b8);
    on_upload(Poll&,dto::Complex&)::$_0::~__0((__0 *)&ok);
    std::__shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&local_158,&alarm.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>);
    Poll::subscribe_alarm(poll,(shared_ptr<Alarm> *)&local_158);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_158._M_refcount);
    nil._M_dataplus._M_p = (pointer)&nil.field_2;
    nil._M_string_length = 0;
    nil.field_2._M_allocated_capacity = nil.field_2._M_allocated_capacity & 0xffffffffffffff00;
    uVar3 = (complex->header).cmd_seq;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_128,"CAN_ADD",(allocator<char> *)local_1b8[0]._M_pod_data);
    iVar7 = TCPServer::get_port(tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
    dto::create(&ok,uVar3,&local_128,&nil,(long)iVar7);
    std::__cxx11::string::~string((string *)&local_128);
    dto::Complex::Complex((Complex *)local_70,&ok);
    respond<dto::Complex>(this,poll,(Complex *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x20));
    poVar9 = std::operator<<((ostream *)&std::cout,
                             "UDPServer: created file upload tcp server listening on port ");
    iVar7 = TCPServer::get_port(tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                               );
    poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar7);
    std::endl<char,std::char_traits<char>>(poVar9);
    std::__cxx11::string::~string((string *)&ok.payload);
    std::__cxx11::string::~string((string *)&nil);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&alarm.super___shared_ptr<Alarm,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__weak_count<(__gnu_cxx::_Lock_policy)2>::~__weak_count
              (&server.super___weak_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&tcp.super___shared_ptr<TCPServer,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&sdir.super___shared_ptr<SharedDirectory,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  else {
    uVar3 = (complex->header).cmd_seq;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_c8,"NO_WAY",(allocator<char> *)&nil);
    dto::create((Simple *)&ok,uVar3,&local_c8,&file_name);
    std::__cxx11::string::~string((string *)&local_c8);
    dto::Simple::Simple((Simple *)local_a8,(Simple *)&ok);
    respond<dto::Simple>(this,poll,(Simple *)local_a8);
    std::__cxx11::string::~string((string *)(local_a8 + 0x18));
    std::__cxx11::string::~string((string *)((long)&ok.header.param + 6));
  }
  std::__cxx11::string::~string((string *)&file_name);
  return;
}

Assistant:

void UDPServer::on_upload(Poll &poll, dto::Complex &complex) {
  std::string file_name = complex.payload;
  if (!dir->can_create_file(complex.header.param, file_name)) {
    auto dto = dto::create(complex.header.cmd_seq, "NO_WAY", file_name);
    respond(poll, dto);
    return;
  }
  dir->reserve_file(file_name, complex.header.param);
  std::shared_ptr<SharedDirectory> sdir = this->dir;

  auto tcp = std::make_shared<TCPServer>(
      std::string("FileUploadServer-") + file_name,
      FileReceiveSession::create_session_factory(dir->path_in_dir(file_name))
  );
  poll.subscribe(tcp);
  std::weak_ptr<TCPServer> server = tcp;
  auto alarm = std::make_shared<Alarm>(timeout * 1000, [server, &poll, file_name, sdir]() -> void {
    if (!server.expired()) {
      poll.unsubscribe(*server.lock());
      sdir->cancel_reserved_file(file_name);
    }
  });
  poll.subscribe_alarm(alarm);
  std::string nil;
  auto ok = dto::create(complex.header.cmd_seq, "CAN_ADD", nil, tcp->get_port());
  respond(poll, ok);
  std::cout << "UDPServer: created file upload tcp server listening on port " << tcp->get_port() << std::endl;
}